

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

bool __thiscall re2::CharClassBuilder::AddRange(CharClassBuilder *this,Rune lo,Rune hi)

{
  int iVar1;
  Rune RVar2;
  bool bVar3;
  bool bVar4;
  int *piVar5;
  pointer pRVar6;
  RuneRange local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  _Self local_b8;
  RuneRange local_b0;
  _Self local_a8;
  iterator it_3;
  _Self local_90;
  RuneRange local_88;
  _Self local_80;
  iterator it_2;
  _Self local_68;
  RuneRange local_60;
  _Self local_58;
  iterator it_1;
  RuneRange local_48;
  _Self local_40;
  iterator it;
  int local_30;
  int local_2c;
  int local_28;
  Rune hi1;
  Rune local_20;
  Rune lo1;
  Rune hi_local;
  Rune lo_local;
  CharClassBuilder *this_local;
  
  if (hi < lo) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = hi;
    lo1 = lo;
    _hi_local = this;
    if ((lo < 0x7b) && (0x40 < hi)) {
      local_28 = 0x41;
      piVar5 = std::max<int>(&lo1,&local_28);
      hi1 = *piVar5;
      local_30 = 0x5a;
      piVar5 = std::min<int>(&local_20,&local_30);
      local_2c = *piVar5;
      if (hi1 <= local_2c) {
        this->upper_ = (1 << (((char)local_2c - (char)hi1) + 1U & 0x1f)) + -1 <<
                       ((char)hi1 + 0xbfU & 0x1f) | this->upper_;
      }
      it._M_node._4_4_ = 0x61;
      piVar5 = std::max<int>(&lo1,(int *)((long)&it._M_node + 4));
      hi1 = *piVar5;
      it._M_node._0_4_ = 0x7a;
      piVar5 = std::min<int>(&local_20,(int *)&it);
      local_2c = *piVar5;
      if (hi1 <= local_2c) {
        this->lower_ = (1 << (((char)local_2c - (char)hi1) + 1U & 0x1f)) + -1 <<
                       ((char)hi1 + 0x9fU & 0x1f) | this->lower_;
      }
    }
    RuneRange::RuneRange(&local_48,lo1,lo1);
    local_40._M_node =
         (_Base_ptr)
         std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                   (&this->ranges_,&local_48);
    it_1 = end(this);
    bVar3 = std::operator!=(&local_40,&it_1);
    bVar4 = false;
    if (bVar3) {
      pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_40);
      RVar2 = local_20;
      bVar4 = false;
      if (pRVar6->lo <= lo1) {
        pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_40);
        bVar4 = RVar2 <= pRVar6->hi;
      }
    }
    if (bVar4) {
      this_local._7_1_ = false;
    }
    else {
      if (0 < lo1) {
        RuneRange::RuneRange(&local_60,lo1 + -1,lo1 + -1);
        local_58._M_node =
             (_Base_ptr)
             std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                       (&this->ranges_,&local_60);
        local_68._M_node = (_Base_ptr)end(this);
        bVar4 = std::operator!=(&local_58,&local_68);
        if (bVar4) {
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_58);
          lo1 = pRVar6->lo;
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_58);
          if (local_20 < pRVar6->hi) {
            pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_58);
            local_20 = pRVar6->hi;
          }
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_58);
          iVar1 = pRVar6->hi;
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_58);
          this->nrunes_ = this->nrunes_ - ((iVar1 - pRVar6->lo) + 1);
          it_2._M_node = (_Base_ptr)
                         std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                         ::erase_abi_cxx11_((set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                                             *)&this->ranges_,local_58._M_node);
        }
      }
      if (local_20 < 0x10ffff) {
        RuneRange::RuneRange(&local_88,local_20 + 1,local_20 + 1);
        local_80._M_node =
             (_Base_ptr)
             std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                       (&this->ranges_,&local_88);
        local_90._M_node = (_Base_ptr)end(this);
        bVar4 = std::operator!=(&local_80,&local_90);
        if (bVar4) {
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_80);
          local_20 = pRVar6->hi;
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_80);
          iVar1 = pRVar6->hi;
          pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_80);
          this->nrunes_ = this->nrunes_ - ((iVar1 - pRVar6->lo) + 1);
          it_3._M_node = (_Base_ptr)
                         std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                         ::erase_abi_cxx11_((set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                                             *)&this->ranges_,local_80._M_node);
        }
      }
      while( true ) {
        RuneRange::RuneRange(&local_b0,lo1,local_20);
        local_a8._M_node =
             (_Base_ptr)
             std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::find
                       (&this->ranges_,&local_b0);
        local_b8._M_node = (_Base_ptr)end(this);
        bVar4 = std::operator==(&local_a8,&local_b8);
        if (bVar4) break;
        pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_a8);
        iVar1 = pRVar6->hi;
        pRVar6 = std::_Rb_tree_const_iterator<re2::RuneRange>::operator->(&local_a8);
        this->nrunes_ = this->nrunes_ - ((iVar1 - pRVar6->lo) + 1);
        local_c0 = local_a8._M_node;
        local_c8 = (_Base_ptr)
                   std::set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>::
                   erase_abi_cxx11_((set<re2::RuneRange,re2::RuneRangeLess,std::allocator<re2::RuneRange>>
                                     *)&this->ranges_,local_a8._M_node);
      }
      this->nrunes_ = (local_20 - lo1) + 1 + this->nrunes_;
      RuneRange::RuneRange(&local_d0,lo1,local_20);
      std::set<re2::RuneRange,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>::insert
                (&this->ranges_,&local_d0);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CharClassBuilder::AddRange(Rune lo, Rune hi) {
  if (hi < lo)
    return false;

  if (lo <= 'z' && hi >= 'A') {
    // Overlaps some alpha, maybe not all.
    // Update bitmaps telling which ASCII letters are in the set.
    Rune lo1 = max<Rune>(lo, 'A');
    Rune hi1 = min<Rune>(hi, 'Z');
    if (lo1 <= hi1)
      upper_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'A');

    lo1 = max<Rune>(lo, 'a');
    hi1 = min<Rune>(hi, 'z');
    if (lo1 <= hi1)
      lower_ |= ((1 << (hi1 - lo1 + 1)) - 1) << (lo1 - 'a');
  }

  {  // Check whether lo, hi is already in the class.
    iterator it = ranges_.find(RuneRange(lo, lo));
    if (it != end() && it->lo <= lo && hi <= it->hi)
      return false;
  }

  // Look for a range abutting lo on the left.
  // If it exists, take it out and increase our range.
  if (lo > 0) {
    iterator it = ranges_.find(RuneRange(lo-1, lo-1));
    if (it != end()) {
      lo = it->lo;
      if (it->hi > hi)
        hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for a range abutting hi on the right.
  // If it exists, take it out and increase our range.
  if (hi < Runemax) {
    iterator it = ranges_.find(RuneRange(hi+1, hi+1));
    if (it != end()) {
      hi = it->hi;
      nrunes_ -= it->hi - it->lo + 1;
      ranges_.erase(it);
    }
  }

  // Look for ranges between lo and hi.  Take them out.
  // This is only safe because the set has no overlapping ranges.
  // We've already removed any ranges abutting lo and hi, so
  // any that overlap [lo, hi] must be contained within it.
  for (;;) {
    iterator it = ranges_.find(RuneRange(lo, hi));
    if (it == end())
      break;
    nrunes_ -= it->hi - it->lo + 1;
    ranges_.erase(it);
  }

  // Finally, add [lo, hi].
  nrunes_ += hi - lo + 1;
  ranges_.insert(RuneRange(lo, hi));
  return true;
}